

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O0

int __thiscall
anon_unknown.dwarf_239b3a::SQLiteBuildDB::open(SQLiteBuildDB *this,char *__file,int __oflag,...)

{
  int iVar1;
  SQLiteBuildDB *pSVar2;
  undefined8 uVar3;
  char *pcVar4;
  int *piVar5;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  allocator local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined8 local_380;
  char *query;
  int local_358;
  allocator local_351;
  int result_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator local_309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8;
  allocator local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  allocator local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  allocator local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  undefined8 local_88;
  sqlite3_stmt *stmt;
  uint32_t clientVersion;
  int version;
  char *cError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  anon_class_1_0_00000001 local_21;
  int result;
  string *error_out_local;
  SQLiteBuildDB *this_local;
  
  pSVar2 = this;
  if (this->db == (sqlite3 *)0x0) {
    _result = (string *)__file;
    error_out_local = (string *)this;
    if (((anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)::sqliteConfigureResult ==
         '\0') &&
       (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::SQLiteBuildDB::
                                     open(std::__cxx11::string*)::sqliteConfigureResult,__file,
                                    ___oflag), iVar1 != 0)) {
      open::sqliteConfigureResult = open::anon_class_1_0_00000001::operator()(&local_21);
      __cxa_guard_release(&(anonymous_namespace)::SQLiteBuildDB::open(std::__cxx11::string*)::
                           sqliteConfigureResult);
    }
    if ((open::sqliteConfigureResult == 0) || (iVar1 = sqlite3_threadsafe(), iVar1 != 0)) {
      uVar3 = std::__cxx11::string::c_str();
      local_28 = sqlite3_open(uVar3,&this->db);
      if (local_28 == 0) {
        sqlite3_busy_timeout(this->db,5000);
        stmt._0_4_ = 0;
        local_28 = sqlite3_prepare_v2(this->db,"SELECT version,client_version FROM info LIMIT 1",
                                      0xffffffff,&local_88,0);
        if (local_28 == 1) {
          stmt._4_4_ = -1;
          local_28 = 1;
        }
        else {
          if (local_28 != 0) {
            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_a8,this);
            std::__cxx11::string::operator=(_result,(string *)&local_a8);
            pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_a8);
            this_local._7_1_ = 0;
            goto LAB_00210958;
          }
          local_28 = sqlite3_step(local_88);
          if (local_28 == 0x65) {
            stmt._4_4_ = -1;
          }
          else {
            if (local_28 != 100) {
              (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                        (&local_c8,this);
              std::__cxx11::string::operator=(_result,(string *)&local_c8);
              std::__cxx11::string::~string((string *)&local_c8);
              pSVar2 = (SQLiteBuildDB *)sqlite3_finalize(local_88);
              this_local._7_1_ = 0;
              goto LAB_00210958;
            }
            iVar1 = sqlite3_column_count(local_88);
            if (iVar1 != 2) {
              __assert_fail("sqlite3_column_count(stmt) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                            ,0xa3,"bool (anonymous namespace)::SQLiteBuildDB::open(std::string *)");
            }
            stmt._4_4_ = sqlite3_column_int(local_88,0);
            stmt._0_4_ = sqlite3_column_int(local_88,1);
          }
          sqlite3_finalize(local_88);
        }
        if ((stmt._4_4_ != 0x11) || ((uint32_t)stmt != this->clientSchemaVersion)) {
          sqlite3_close(this->db);
          this->db = (sqlite3 *)0x0;
          if ((this->recreateOnUnmatchedVersion & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1e8,"Version mismatch. (database-schema: ",&local_1e9);
            std::__cxx11::to_string(&local_210,stmt._4_4_);
            std::operator+(&local_1c8,&local_1e8,&local_210);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_230," requested schema: ",&local_231);
            std::operator+(&local_1a8,&local_1c8,&local_230);
            std::__cxx11::to_string(&local_258,0x11);
            std::operator+(&local_188,&local_1a8,&local_258);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_278,". database-client: ",&local_279);
            std::operator+(&local_168,&local_188,&local_278);
            std::__cxx11::to_string(&local_2a0,(uint32_t)stmt);
            std::operator+(&local_148,&local_168,&local_2a0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_2c0," requested client: ",&local_2c1);
            std::operator+(&local_128,&local_148,&local_2c0);
            std::__cxx11::to_string(&local_2e8,this->clientSchemaVersion);
            std::operator+(&local_108,&local_128,&local_2e8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_308,")",&local_309);
            std::operator+(&local_e8,&local_108,&local_308);
            std::__cxx11::string::operator=(_result,(string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_308);
            std::allocator<char>::~allocator((allocator<char> *)&local_309);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_2e8);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_2c0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_278);
            std::allocator<char>::~allocator((allocator<char> *)&local_279);
            std::__cxx11::string::~string((string *)&local_188);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_1a8);
            std::__cxx11::string::~string((string *)&local_230);
            std::allocator<char>::~allocator((allocator<char> *)&local_231);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_1e8);
            pSVar2 = (SQLiteBuildDB *)
                     std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            this_local._7_1_ = 0;
            goto LAB_00210958;
          }
          pcVar4 = (char *)std::__cxx11::string::c_str();
          local_28 = llbuild::basic::sys::unlink(pcVar4);
          if (local_28 == -1) {
            piVar5 = __errno_location();
            if (*piVar5 != 2) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&result_1,"unable to unlink existing database: ",&local_351);
              piVar5 = __errno_location();
              pcVar4 = strerror(*piVar5);
              std::operator+(&local_330,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &result_1,pcVar4);
              std::__cxx11::string::operator=(_result,(string *)&local_330);
              std::__cxx11::string::~string((string *)&local_330);
              std::__cxx11::string::~string((string *)&result_1);
              std::allocator<char>::~allocator((allocator<char> *)&local_351);
              sqlite3_close(this->db);
              this->db = (sqlite3 *)0x0;
              this_local._7_1_ = 0;
              goto LAB_00210958;
            }
          }
          else {
            uVar3 = std::__cxx11::string::c_str();
            local_358 = sqlite3_open(uVar3,&this->db);
            if (local_358 != 0) {
              (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                        ((string *)&query,this);
              std::__cxx11::string::operator=(_result,(string *)&query);
              pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&query);
              this_local._7_1_ = 0;
              goto LAB_00210958;
            }
            local_358 = 0;
          }
          local_28 = sqlite3_exec(this->db,"BEGIN EXCLUSIVE;",0,0,&clientVersion);
          if (local_28 == 0) {
            local_28 = sqlite3_exec(this->db,
                                    "CREATE TABLE info (id INTEGER PRIMARY KEY, version INTEGER, client_version INTEGER, iteration INTEGER);"
                                    ,0,0,&clientVersion);
          }
          if (local_28 == 0) {
            local_380 = sqlite3_mprintf("INSERT INTO info VALUES (0, %d, %d, 0);",0x11,
                                        this->clientSchemaVersion);
            local_28 = sqlite3_exec(this->db,local_380,0,0,&clientVersion);
            sqlite3_free(local_380);
          }
          if (local_28 == 0) {
            local_28 = sqlite3_exec(this->db,
                                    "CREATE TABLE key_names (id INTEGER PRIMARY KEY, key STRING UNIQUE);"
                                    ,0,0,&clientVersion);
          }
          if (local_28 == 0) {
            local_28 = sqlite3_exec(this->db,
                                    "CREATE TABLE rule_results (key_id INTEGER PRIMARY KEY, value BLOB, signature INTEGER, built_at INTEGER, computed_at INTEGER, start REAL, end REAL, dependencies BLOB, FOREIGN KEY(key_id) REFERENCES key_names(id));"
                                    ,0,0,&clientVersion);
          }
          if (local_28 == 0) {
            local_28 = sqlite3_exec(this->db,
                                    "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);"
                                    ,0,0,&clientVersion);
          }
          if (local_28 == 0) {
            local_28 = sqlite3_exec(this->db,"END;",0,0,&clientVersion);
          }
          if (local_28 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_3e0,"unable to initialize database (",&local_3e1);
            std::operator+(&local_3c0,&local_3e0,_clientVersion);
            std::operator+(&local_3a0,&local_3c0,")");
            std::__cxx11::string::operator=(_result,(string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_3a0);
            std::__cxx11::string::~string((string *)&local_3c0);
            std::__cxx11::string::~string((string *)&local_3e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
            sqlite3_free(_clientVersion);
            sqlite3_close(this->db);
            this->db = (sqlite3 *)0x0;
            this_local._7_1_ = 0;
            goto LAB_00210958;
          }
        }
        local_28 = sqlite3_prepare_v2(this->db,"SELECT id FROM key_names WHERE key == ? LIMIT 1;",
                                      0xffffffff,&this->findKeyIDForKeyStmt,0);
        if (local_28 == 0) {
          local_28 = sqlite3_prepare_v2(this->db,"SELECT key FROM key_names WHERE id == ? LIMIT 1;",
                                        0xffffffff,&this->findKeyNameForKeyIDStmt,0);
          if (local_28 == 0) {
            local_28 = sqlite3_prepare_v2(this->db,
                                          "INSERT OR IGNORE INTO key_names(key) VALUES (?);",
                                          0xffffffff,&this->insertIntoKeysStmt,0);
            if (local_28 == 0) {
              local_28 = sqlite3_prepare_v2(this->db,
                                            "INSERT OR REPLACE INTO rule_results VALUES (?, ?, ?, ?, ?, ?, ?, ?);"
                                            ,0xffffffff,&this->insertIntoRuleResultsStmt,0);
              if (local_28 == 0) {
                local_28 = sqlite3_prepare_v2(this->db,"DELETE FROM key_names WHERE key == ?;",
                                              0xffffffff,&this->deleteFromKeysStmt,0);
                if (local_28 == 0) {
                  local_28 = sqlite3_prepare_v2(this->db,
                                                "SELECT rule_results.key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results INNER JOIN key_names ON key_names.id = rule_results.key_id WHERE key == ?;"
                                                ,0xffffffff,&this->findRuleResultStmt,0);
                  if (local_28 == 0) {
                    local_28 = sqlite3_prepare_v2(this->db,
                                                  "SELECT key_id, value, built_at, computed_at, start, end, dependencies, signature FROM rule_results WHERE key_id == ?;"
                                                  ,0xffffffff,&this->fastFindRuleResultStmt,0);
                    if (local_28 == 0) {
                      pSVar2 = (SQLiteBuildDB *)
                               sqlite3_prepare_v2(this->db,
                                                  "SELECT rule_results.key_id, key_names.key, rule_results.value, rule_results.built_at, rule_results.computed_at, rule_results.start, rule_results.end, rule_results.dependencies, rule_results.signature FROM rule_results JOIN key_names WHERE rule_results.key_id == key_names.id;"
                                                  ,0xffffffff,&this->getKeysWithResultStmt,0);
                      local_28 = (int)pSVar2;
                      if (local_28 == 0) {
                        this_local._7_1_ = 1;
                      }
                      else {
                        (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                  (&local_4e8,this);
                        std::__cxx11::string::operator=(_result,(string *)&local_4e8);
                        pSVar2 = (SQLiteBuildDB *)
                                 std::__cxx11::string::~string((string *)&local_4e8);
                        this_local._7_1_ = 0;
                      }
                    }
                    else {
                      (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                                (&local_4c8,this);
                      std::__cxx11::string::operator=(_result,(string *)&local_4c8);
                      pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_4c8);
                      this_local._7_1_ = 0;
                    }
                  }
                  else {
                    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                              (&local_4a8,this);
                    std::__cxx11::string::operator=(_result,(string *)&local_4a8);
                    pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_4a8);
                    this_local._7_1_ = 0;
                  }
                }
                else {
                  (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                            (&local_488,this);
                  std::__cxx11::string::operator=(_result,(string *)&local_488);
                  pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_488);
                  this_local._7_1_ = 0;
                }
              }
              else {
                (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                          (&local_468,this);
                std::__cxx11::string::operator=(_result,(string *)&local_468);
                pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_468);
                this_local._7_1_ = 0;
              }
            }
            else {
              (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_
                        (&local_448,this);
              std::__cxx11::string::operator=(_result,(string *)&local_448);
              pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_448);
              this_local._7_1_ = 0;
            }
          }
          else {
            (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_428,this)
            ;
            std::__cxx11::string::operator=(_result,(string *)&local_428);
            pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_428);
            this_local._7_1_ = 0;
          }
        }
        else {
          (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_408,this);
          std::__cxx11::string::operator=(_result,(string *)&local_408);
          pSVar2 = (SQLiteBuildDB *)std::__cxx11::string::~string((string *)&local_408);
          this_local._7_1_ = 0;
        }
      }
      else {
        pcVar4 = (char *)sqlite3_errstr(local_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_68,pcVar4,(allocator *)((long)&cError + 7));
        std::operator+(&local_48,"unable to open database: ",&local_68);
        std::__cxx11::string::operator=(_result,(string *)&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        pSVar2 = (SQLiteBuildDB *)
                 std::allocator<char>::~allocator((allocator<char> *)((long)&cError + 7));
        this_local._7_1_ = 0;
      }
    }
    else {
      pSVar2 = (SQLiteBuildDB *)
               std::__cxx11::string::operator=
                         (_result,"unable to configure database: not thread-safe");
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_00210958:
  return (int)CONCAT71((int7)((ulong)pSVar2 >> 8),this_local._7_1_);
}

Assistant:

bool open(std::string *error_out) {
    // The db is opened lazily whenever an operation on it occurs. Thus if it is
    // already open, we don't need to do any further work.
    if (db) return true;

    // Configure SQLite3 on first use.
    //
    // We attempt to set multi-threading mode, but can settle for serialized if
    // the library can't be reinitialized (there are only two modes).
    static int sqliteConfigureResult = []() -> int {
      // We access a single connection from multiple threads.
      return sqlite3_config(SQLITE_CONFIG_MULTITHREAD);
    }();
    if (sqliteConfigureResult != SQLITE_OK) {
        if (!sqlite3_threadsafe()) {
            *error_out = "unable to configure database: not thread-safe";
            return false;
        }
    }

    int result = sqlite3_open(path.c_str(), &db);
    if (result != SQLITE_OK) {
      *error_out = "unable to open database: " + std::string(
          sqlite3_errstr(result));
      return false;
    }

    sqlite3_busy_timeout(db, 5000);
    // Create the database schema, if necessary.
    char *cError;
    int version;
    uint32_t clientVersion = 0;
    sqlite3_stmt* stmt;
    result = sqlite3_prepare_v2(
      db, "SELECT version,client_version FROM info LIMIT 1",
      -1, &stmt, nullptr);
    if (result == SQLITE_ERROR) {
      version = -1;
    } else {
      if (result != SQLITE_OK) {
        *error_out = getCurrentErrorMessage();
        return false;
      }
      result = sqlite3_step(stmt);
      if (result == SQLITE_DONE) {
        version = -1;
      } else if (result == SQLITE_ROW) {
        assert(sqlite3_column_count(stmt) == 2);
        version = sqlite3_column_int(stmt, 0);
        clientVersion = sqlite3_column_int(stmt, 1);
      } else {
        *error_out = getCurrentErrorMessage();
        sqlite3_finalize(stmt);
        return false;
      }
      sqlite3_finalize(stmt);
    }

    if (version != currentSchemaVersion ||
        clientVersion != clientSchemaVersion) {
      // Close the database before we try to recreate it.
      sqlite3_close(db);
      db = nullptr;
      
      if (!recreateOnUnmatchedVersion) {
        // We don't re-create the database in this case and return an error
        *error_out = std::string("Version mismatch. (database-schema: ") + std::to_string(version) + std::string(" requested schema: ") + std::to_string(currentSchemaVersion) + std::string(". database-client: ") + std::to_string(clientVersion) + std::string(" requested client: ") + std::to_string(clientSchemaVersion) + std::string(")");
        return false;
      }

      // Always recreate the database from scratch when the schema changes.
      result = basic::sys::unlink(path.c_str());
      if (result == -1) {
        if (errno != ENOENT) {
          *error_out = std::string("unable to unlink existing database: ") +
            ::strerror(errno);
          sqlite3_close(db);
          db = nullptr;
          return false;
        }
      } else {
        // If the remove was successful, reopen the database.
        int result = sqlite3_open(path.c_str(), &db);
        if (result != SQLITE_OK) {
          *error_out = getCurrentErrorMessage();
          return false;
        }
      }

      // Create the schema in a single transaction.
      result = sqlite3_exec(db, "BEGIN EXCLUSIVE;", nullptr, nullptr, &cError);

      // Create the info table.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE info ("
               "id INTEGER PRIMARY KEY, "
               "version INTEGER, "
               "client_version INTEGER, "
               "iteration INTEGER);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        char* query = sqlite3_mprintf(
          "INSERT INTO info VALUES (0, %d, %d, 0);",
          currentSchemaVersion, clientSchemaVersion);
        result = sqlite3_exec(db, query, nullptr, nullptr, &cError);
        sqlite3_free(query);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE key_names ("
               "id INTEGER PRIMARY KEY, "
               "key STRING UNIQUE);"),
          nullptr, nullptr, &cError);
      }
      if (result == SQLITE_OK) {
        result = sqlite3_exec(
          db, ("CREATE TABLE rule_results ("
               "key_id INTEGER PRIMARY KEY, "
               "value BLOB, "
               "signature INTEGER, "
               "built_at INTEGER, "
               "computed_at INTEGER, "
               "start REAL, "
               "end REAL, "
               "dependencies BLOB, "
               "FOREIGN KEY(key_id) REFERENCES key_names(id));"),
          nullptr, nullptr, &cError);
      }

      // Create the indices on the rule tables.
      if (result == SQLITE_OK) {
        // Create an index to be used for efficiently looking up rule
        // information from a key.
        result = sqlite3_exec(
            db, "CREATE UNIQUE INDEX rule_results_idx ON rule_results (key_id);",
            nullptr, nullptr, &cError);
      }

      // Sync changes to disk.
      if (result == SQLITE_OK) {
        result = sqlite3_exec(db, "END;", nullptr, nullptr, &cError);
      }

      if (result != SQLITE_OK) {
        *error_out = (std::string("unable to initialize database (") + cError
                      + ")");
        sqlite3_free(cError);
        sqlite3_close(db);
        db = nullptr;
        return false;
      }
    }

    // Initialize prepared statements.
    result = sqlite3_prepare_v2(
      db, findKeyIDForKeyStmtSQL,
      -1, &findKeyIDForKeyStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findKeyNameForKeyIDStmtSQL,
      -1, &findKeyNameForKeyIDStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoKeysStmtSQL,
      -1, &insertIntoKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, insertIntoRuleResultsStmtSQL,
      -1, &insertIntoRuleResultsStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, deleteFromKeysStmtSQL,
      -1, &deleteFromKeysStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, findRuleResultStmtSQL,
      -1, &findRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    result = sqlite3_prepare_v2(
      db, fastFindRuleResultStmtSQL,
      -1, &fastFindRuleResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);
    
    result = sqlite3_prepare_v2(
      db, getKeysWithResultStmtSQL,
      -1, &getKeysWithResultStmt, nullptr);
    checkSQLiteResultOKReturnFalse(result);

    return true;
  }